

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O1

void tommy_trie_init(tommy_trie *trie,tommy_allocator *alloc)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(trie,0,0x100);
  trie->count = 0;
  trie->node_count = 0;
  trie->alloc = alloc;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_trie_init(tommy_trie* trie, tommy_allocator* alloc)
{
	tommy_uint_t i;

	for (i = 0; i < TOMMY_TRIE_BUCKET_MAX; ++i)
		trie->bucket[i] = 0;

	trie->count = 0;
	trie->node_count = 0;

	trie->alloc = alloc;
}